

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void iDynTree::reportDebug(char *className,char *methodName,char *message)

{
  ostream *poVar1;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"[DEBUG] ");
  poVar1 = std::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1," :: ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void reportDebug(const char* className, const char* methodName, const char* message)
    {
        std::cerr << "[DEBUG] " << className << " :: " << methodName << " : " << message <<  "\n";
    }